

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingUniformBlockArrayTest::checkBinding
          (BindingUniformBlockArrayTest *this,program *program,GLuint index,GLint expected_binding)

{
  deUint32 dVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *pTVar3;
  int local_80 [2];
  GLint binding;
  int local_6c;
  char local_68 [4];
  GLuint uniform_index;
  GLchar buffer [64];
  Functions *gl;
  GLint expected_binding_local;
  GLuint index_local;
  program *program_local;
  BindingUniformBlockArrayTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context);
  buffer._56_4_ = (*pRVar2->_vptr_RenderContext[3])();
  buffer._60_4_ = extraout_var;
  sprintf(local_68,"GOKU[%d]",(ulong)index);
  local_6c = (**(code **)(buffer._56_8_ + 0xb38))(program->m_program_object_id,local_68);
  dVar1 = (**(code **)(buffer._56_8_ + 0x800))();
  glu::checkError(dVar1,"GetUniformBlockIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x227d);
  if (local_6c == -1) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Uniform block is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x2280);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_80[0] = -1;
  (**(code **)(buffer._56_8_ + 0x760))(program->m_program_object_id,local_6c,0x8a3f,local_80);
  dVar1 = (**(code **)(buffer._56_8_ + 0x800))();
  glu::checkError(dVar1,"GetActiveUniformBlockiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x2286);
  if (expected_binding != local_80[0]) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Wrong binding reported by API",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x228a);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void BindingUniformBlockArrayTest::checkBinding(Utils::program& program, glw::GLuint index, glw::GLint expected_binding)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLchar buffer[64];
	sprintf(buffer, "GOKU[%d]", index);

	const GLuint uniform_index = gl.getUniformBlockIndex(program.m_program_object_id, buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformBlockIndex");
	if (GL_INVALID_INDEX == uniform_index)
	{
		TCU_FAIL("Uniform block is inactive");
	}

	GLint binding = -1;

	gl.getActiveUniformBlockiv(program.m_program_object_id, uniform_index, GL_UNIFORM_BLOCK_BINDING, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformBlockiv");

	if (expected_binding != binding)
	{
		TCU_FAIL("Wrong binding reported by API");
	}
}